

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

Abc_Nam_t * Abc_NtkNameMan(Abc_Ntk_t *p,int fOuts)

{
  int iVar1;
  Abc_Nam_t *p_00;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  if (fOuts == 0) {
    p_00 = Abc_NamStart(p->vCis->nSize,0x18);
    pVVar3 = p->vCis;
    if (pVVar3->nSize < 1) {
      iVar4 = 1;
    }
    else {
      lVar5 = 0;
      do {
        pcVar2 = Nm_ManCreateUniqueName
                           (*(Nm_Man_t **)(*pVVar3->pArray[lVar5] + 0x18),
                            (int)*(long *)((long)pVVar3->pArray[lVar5] + 0x10));
        Abc_NamStrFindOrAdd(p_00,pcVar2,(int *)0x0);
        lVar5 = lVar5 + 1;
        pVVar3 = p->vCis;
      } while (lVar5 < pVVar3->nSize);
      iVar4 = (int)lVar5 + 1;
    }
    iVar1 = Abc_NamObjNumMax(p_00);
    if (iVar1 != iVar4) {
      __assert_fail("Abc_NamObjNumMax(pStrsCi) == i + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                    ,0x180,"Abc_Nam_t *Abc_NtkNameMan(Abc_Ntk_t *, int)");
    }
  }
  else {
    p_00 = Abc_NamStart(p->vCos->nSize,0x18);
    pVVar3 = p->vCos;
    if (pVVar3->nSize < 1) {
      iVar4 = 1;
    }
    else {
      lVar5 = 0;
      do {
        pcVar2 = Nm_ManCreateUniqueName
                           (*(Nm_Man_t **)(*pVVar3->pArray[lVar5] + 0x18),
                            (int)*(long *)((long)pVVar3->pArray[lVar5] + 0x10));
        Abc_NamStrFindOrAdd(p_00,pcVar2,(int *)0x0);
        lVar5 = lVar5 + 1;
        pVVar3 = p->vCos;
      } while (lVar5 < pVVar3->nSize);
      iVar4 = (int)lVar5 + 1;
    }
    iVar1 = Abc_NamObjNumMax(p_00);
    if (iVar1 != iVar4) {
      __assert_fail("Abc_NamObjNumMax(pStrsCo) == i + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                    ,0x177,"Abc_Nam_t *Abc_NtkNameMan(Abc_Ntk_t *, int)");
    }
  }
  return p_00;
}

Assistant:

Abc_Nam_t * Abc_NtkNameMan( Abc_Ntk_t * p, int fOuts )
{
    if ( fOuts )
    {
        Abc_Obj_t * pObj;  int i;
        Abc_Nam_t * pStrsCo = Abc_NamStart( Abc_NtkCoNum(p), 24 );
        Abc_NtkForEachCo( p, pObj, i )
            Abc_NamStrFindOrAdd( pStrsCo, Abc_ObjName(pObj), NULL );
        assert( Abc_NamObjNumMax(pStrsCo) == i + 1 );
        return pStrsCo;
    }
    else
    {
        Abc_Obj_t * pObj;  int i;
        Abc_Nam_t * pStrsCi = Abc_NamStart( Abc_NtkCiNum(p), 24 );
        Abc_NtkForEachCi( p, pObj, i )
            Abc_NamStrFindOrAdd( pStrsCi, Abc_ObjName(pObj), NULL );
        assert( Abc_NamObjNumMax(pStrsCi) == i + 1 );
        return pStrsCi;
   }
}